

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

bool __thiscall position::is_draw(position *this)

{
  U64 UVar1;
  U64 UVar2;
  uint uVar3;
  bool bVar4;
  
  bVar4 = true;
  if ((this->ifo).move50 < 100) {
    uVar3 = (int)this->hidx - 2;
    if ((int)uVar3 < 0) {
      return false;
    }
    UVar1 = (this->ifo).repkey;
    do {
      UVar2 = this->history[uVar3].repkey;
      bVar4 = UVar1 == UVar2;
      if ((int)uVar3 < 2) {
        return bVar4;
      }
      uVar3 = uVar3 - 2;
    } while (UVar1 != UVar2);
  }
  return bVar4;
}

Assistant:

bool position::is_draw() {

	if (ifo.move50 > 99) 
		return true;

	U64 kcurrent = ifo.repkey;
	unsigned same_count = 0;
	int idx = hidx - 2;
	while (same_count == 0 && idx >= 0) {
		same_count += (kcurrent == history[idx].repkey);
		idx -= 2;
	}

	return same_count > 0;
}